

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

zip_t * zip_openwitherror(char *zipname,int level,char mode,int *errnum)

{
  mz_bool mVar1;
  size_t sVar2;
  FILE *__stream;
  FILE *fp;
  zip_t *zip;
  int *errnum_local;
  char mode_local;
  int level_local;
  char *zipname_local;
  
  fp = (FILE *)0x0;
  *errnum = 0;
  if ((zipname == (char *)0x0) || (sVar2 = strlen(zipname), sVar2 == 0)) {
    *errnum = -0x16;
  }
  else {
    errnum_local._4_4_ = level;
    if (level < 0) {
      errnum_local._4_4_ = 6;
    }
    if ((errnum_local._4_4_ & 0xf) < 0xb) {
      fp = (FILE *)calloc(1,0x4e078);
      if ((zip_t *)fp == (zip_t *)0x0) {
        *errnum = -0x15;
      }
      else {
        ((zip_t *)fp)->level = errnum_local._4_4_;
        (((zip_t *)fp)->entry).index = -1;
        switch(mode) {
        case 'a':
        case 'd':
          __stream = fopen(zipname,"r+b");
          if (__stream == (FILE *)0x0) {
            *errnum = -0x10;
          }
          else {
            mVar1 = mz_zip_reader_init_cfile
                              ((mz_zip_archive *)fp,(FILE *)__stream,0,((zip_t *)fp)->level | 0x800)
            ;
            if (mVar1 == 0) {
              *errnum = -0x1e;
              fclose(__stream);
            }
            else {
              mVar1 = mz_zip_writer_init_from_reader_v2((mz_zip_archive *)fp,zipname,0);
              if (mVar1 != 0) {
                (((zip_t *)fp)->archive).m_zip_type = MZ_ZIP_TYPE_FILE;
                return (zip_t *)fp;
              }
              *errnum = -0x20;
              fclose(__stream);
              mz_zip_reader_end((mz_zip_archive *)fp);
            }
          }
          break;
        default:
          *errnum = -4;
          break;
        case 'r':
          mVar1 = mz_zip_reader_init_file_v2
                            ((mz_zip_archive *)fp,zipname,((zip_t *)fp)->level | 0x800,0,0);
          if (mVar1 != 0) {
            return (zip_t *)fp;
          }
          *errnum = -0x1e;
          break;
        case 'w':
          mVar1 = mz_zip_writer_init_file_v2((mz_zip_archive *)fp,zipname,0,0x4000);
          if (mVar1 != 0) {
            return (zip_t *)fp;
          }
          *errnum = -0x1f;
        }
      }
    }
    else {
      *errnum = -5;
    }
  }
  if (fp != (FILE *)0x0) {
    free(fp);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_openwitherror(const char *zipname, int level, char mode,
                                int *errnum) {
  struct zip_t *zip = NULL;
  *errnum = 0;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    *errnum = ZIP_EINVZIPNAME;
    goto cleanup;
  }

  if (level < 0)
    level = MZ_DEFAULT_LEVEL;
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    *errnum = ZIP_EINVLVL;
    goto cleanup;
  }

  zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip) {
    // out of memory
    *errnum = ZIP_EOOMEM;
    goto cleanup;
  }

  zip->level = (mz_uint)level;
  zip->entry.index = -1;
  switch (mode) {
  case 'w':
    // Create a new archive.
    if (!mz_zip_writer_init_file_v2(&(zip->archive), zipname, 0,
                                    MZ_ZIP_FLAG_WRITE_ZIP64)) {
      // Cannot initialize zip_archive writer
      *errnum = ZIP_EWINIT;
      goto cleanup;
    }
    break;

  case 'r':
    if (!mz_zip_reader_init_file_v2(
            &(zip->archive), zipname,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY, 0, 0)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
    break;

  case 'a':
  case 'd': {
    MZ_FILE *fp = MZ_FOPEN(zipname, "r+b");
    if (!fp) {
      *errnum = ZIP_EOPNFILE;
      goto cleanup;
    }
    if (!mz_zip_reader_init_cfile(
            &(zip->archive), fp, 0,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize zip_archive
      // reader
      *errnum = ZIP_ERINIT;
      fclose(fp);
      goto cleanup;
    }
    if (!mz_zip_writer_init_from_reader_v2(&(zip->archive), zipname, 0)) {
      *errnum = ZIP_EWRINIT;
      fclose(fp);
      mz_zip_reader_end(&(zip->archive));
      goto cleanup;
    }
    // The file pointer is now owned by the archive object.
    zip->archive.m_zip_type = MZ_ZIP_TYPE_FILE;
  } break;

  default:
    *errnum = ZIP_EINVMODE;
    goto cleanup;
  }

  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}